

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_picker::piece_block_request*,std::vector<libtorrent::aux::hash_picker::piece_block_request,std::allocator<libtorrent::aux::hash_picker::piece_block_request>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 local_8;
  
  iVar1 = *(int *)(__a + 2);
  iVar2 = *(int *)(__b + 2);
  iVar3 = *(int *)(__c + 2);
  if (iVar1 < iVar2) {
    if (iVar2 < iVar3) {
LAB_001c4dce:
      uVar4 = __result[2];
      uVar5 = *__result;
      uVar6 = __result[1];
      *(undefined4 *)(__result + 2) = *(undefined4 *)(__b + 2);
      uVar7 = __b[1];
      *__result = *__b;
      __result[1] = uVar7;
      local_8 = (undefined4)uVar4;
      *(undefined4 *)(__b + 2) = local_8;
      *__b = uVar5;
      __b[1] = uVar6;
      return;
    }
    if (iVar1 < iVar3) {
LAB_001c4da1:
      uVar4 = __result[2];
      uVar5 = *__result;
      uVar6 = __result[1];
      *(undefined4 *)(__result + 2) = *(undefined4 *)(__c + 2);
      uVar7 = __c[1];
      *__result = *__c;
      __result[1] = uVar7;
      local_8 = (undefined4)uVar4;
      *(undefined4 *)(__c + 2) = local_8;
      *__c = uVar5;
      __c[1] = uVar6;
      return;
    }
  }
  else if (iVar3 <= iVar1) {
    if (iVar2 < iVar3) goto LAB_001c4da1;
    goto LAB_001c4dce;
  }
  uVar4 = __result[2];
  uVar5 = *__result;
  uVar6 = __result[1];
  *(undefined4 *)(__result + 2) = *(undefined4 *)(__a + 2);
  uVar7 = __a[1];
  *__result = *__a;
  __result[1] = uVar7;
  local_8 = (undefined4)uVar4;
  *(undefined4 *)(__a + 2) = local_8;
  *__a = uVar5;
  __a[1] = uVar6;
  return;
}

Assistant:

bool operator<(piece_block_request const& o) const
			{ return num_requests < o.num_requests; }